

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanInf.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_515e::FloatxNanInfTest_cast_nans_Test::TestBody
          (FloatxNanInfTest_cast_nans_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  fp_t constnan;
  T2 b;
  T1 a;
  flexfloat<(unsigned_char)__x02_,_(unsigned_char)__x03_> *in_stack_fffffffffffffee8;
  flexfloat<(unsigned_char)__n_,_(unsigned_char)_2_> *in_stack_fffffffffffffef0;
  flexfloat<(unsigned_char)__n_,_(unsigned_char)_2_> *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  int line;
  double *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  Type in_stack_ffffffffffffff1c;
  AssertHelper *in_stack_ffffffffffffff20;
  AssertHelper *this_01;
  char *in_stack_ffffffffffffff28;
  AssertionResult local_b8 [2];
  undefined8 local_98;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff78;
  AssertHelper *in_stack_ffffffffffffff80;
  AssertionResult local_60;
  undefined8 local_50;
  flexfloat<(unsigned_char)__n_,_(unsigned_char)_2_> local_48;
  undefined8 local_38;
  flexfloat<(unsigned_char)__n_,_(unsigned_char)_2_> local_30;
  undefined8 local_20;
  
  local_20 = 0x7ff8000000000000;
  flexfloat<(unsigned_char)'\x02',_(unsigned_char)'\x03'>::flexfloat<double>
            ((flexfloat<(unsigned_char)__x02_,_(unsigned_char)__x03_> *)in_stack_fffffffffffffef0,
             (double *)in_stack_fffffffffffffee8);
  local_38 = 0;
  flexfloat<(unsigned_char)'\n',_(unsigned_char)'2'>::flexfloat<double>
            (in_stack_fffffffffffffef0,(double *)in_stack_fffffffffffffee8);
  flexfloat<(unsigned_char)10,(unsigned_char)50>::flexfloat<(unsigned_char)2,(unsigned_char)3>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  flexfloat<(unsigned_char)'\n',_(unsigned_char)'2'>::operator=(&local_30,&local_48);
  local_50 = 0x7ff8000000000000;
  testing::internal::
  CmpHelperNE<flexfloat<(unsigned_char)2,(unsigned_char)3>,flexfloat<(unsigned_char)2,(unsigned_char)3>>
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
             (flexfloat<(unsigned_char)__x02_,_(unsigned_char)__x03_> *)in_stack_fffffffffffffef8,
             (flexfloat<(unsigned_char)__x02_,_(unsigned_char)__x03_> *)in_stack_fffffffffffffef0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff20);
    in_stack_ffffffffffffff08 =
         testing::AssertionResult::failure_message((AssertionResult *)0x176c25);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,(char *)in_stack_ffffffffffffff10
               ,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20),in_stack_ffffffffffffff00);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff80,(Message *)in_stack_ffffffffffffff78._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffef0);
    testing::Message::~Message((Message *)0x176c82);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x176cf0);
  local_98 = 0x7ff8000000000000;
  testing::internal::CmpHelperNE<flexfloat<(unsigned_char)2,(unsigned_char)3>,double>
            (in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20,
             (flexfloat<(unsigned_char)__x02_,_(unsigned_char)__x03_> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),in_stack_ffffffffffffff10
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff70);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff20);
    in_stack_ffffffffffffff00 =
         testing::AssertionResult::failure_message((AssertionResult *)0x176d6e);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,(char *)in_stack_ffffffffffffff10
               ,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20),in_stack_ffffffffffffff00);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff80,(Message *)in_stack_ffffffffffffff78._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffef0);
    testing::Message::~Message((Message *)0x176dbc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x176e24);
  testing::internal::
  CmpHelperNE<flexfloat<(unsigned_char)10,(unsigned_char)50>,flexfloat<(unsigned_char)10,(unsigned_char)50>>
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
             in_stack_fffffffffffffef0);
  line = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff20);
    testing::AssertionResult::failure_message((AssertionResult *)0x176e80);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,(char *)in_stack_ffffffffffffff10
               ,line,in_stack_ffffffffffffff00);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff80,(Message *)in_stack_ffffffffffffff78._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffef0);
    testing::Message::~Message((Message *)0x176ece);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x176f33);
  this_01 = (AssertHelper *)0x7ff8000000000000;
  testing::internal::CmpHelperNE<flexfloat<(unsigned_char)10,(unsigned_char)50>,double>
            (in_stack_ffffffffffffff28,(char *)0x7ff8000000000000,
             (flexfloat<(unsigned_char)__n_,_(unsigned_char)_2_> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),in_stack_ffffffffffffff10
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff28);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x176f9f)
    ;
    testing::internal::AssertHelper::AssertHelper
              (this_01,in_stack_ffffffffffffff1c,(char *)in_stack_ffffffffffffff10,line,
               in_stack_ffffffffffffff00);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff80,(Message *)in_stack_ffffffffffffff78._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x176fed);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17704f);
  return;
}

Assistant:

TEST(FloatxNanInfTest, cast_nans)
{
    using T1 = flexfloat<2, 3>;
    #ifdef FLEXFLOAT_ON_SINGLE
    using T2 = flexfloat<7, 21>;
    #endif
    #ifdef FLEXFLOAT_ON_DOUBLE
    using T2 = flexfloat<10, 50>;
    #endif
    #ifdef FLEXFLOAT_ON_QUAD
    using T2 = flexfloat<12, 100>;
    #endif
    T1 a = 0.0 / 0.0;
    T2 b = 0.0;
    b = a;

    fp_t constnan =  nan;

    EXPECT_NE(a, a);    // holds only for NANs
    EXPECT_NE(a, nan);  // holds only for NANs
    // EXPECT_EQ(*reinterpret_cast<uint_t*>(&a),
    //           *reinterpret_cast<uint_t*>(&constnan));

    EXPECT_NE(b, b);    // holds only for NANs
    EXPECT_NE(b, nan);  // holds only for NANs

}